

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minihttp.cpp
# Opt level: O2

bool __thiscall minihttp::TcpSocket::SendBytes(TcpSocket *this,void *str,uint len)

{
  uint uVar1;
  bool bVar2;
  int __fd;
  ulong uVar4;
  uchar *puVar3;
  
  bVar2 = true;
  if (len != 0) {
    uVar4 = 0;
    if (this->_s == -1) {
LAB_00108085:
      bVar2 = false;
    }
    else {
      do {
        while( true ) {
          puVar3 = (uchar *)(uVar4 + (long)str);
          uVar1 = _writeBytes(this,(uchar *)(uVar4 + (long)str),(ulong)(len - (int)uVar4));
          __fd = (int)puVar3;
          if (0 < (int)uVar1) break;
          if ((int)uVar1 < 0) {
            if (uVar1 == 0xffffffff) {
              _GetError();
            }
            close(this,__fd);
            goto LAB_00108085;
          }
        }
        if (len < uVar1) {
          __assert_fail("(unsigned)ret <= len",
                        "/workspace/llm4binary/github/license_c_cmakelists/fgenesis[P]minihttp/minihttp.cpp"
                        ,0x291,"bool minihttp::TcpSocket::SendBytes(const void *, unsigned int)");
        }
        uVar1 = (int)uVar4 + uVar1;
        uVar4 = (ulong)uVar1;
      } while (uVar1 < len);
      if (uVar1 != len) {
        __assert_fail("written == len",
                      "/workspace/llm4binary/github/license_c_cmakelists/fgenesis[P]minihttp/minihttp.cpp"
                      ,0x2a0,"bool minihttp::TcpSocket::SendBytes(const void *, unsigned int)");
      }
    }
  }
  return bVar2;
}

Assistant:

bool TcpSocket::SendBytes(const void *str, unsigned int len)
{
    if(!len)
        return true;
    if(!SOCKETVALID(_s))
        return false;
    //traceprint("SEND: '%s'\n", str);

    unsigned written = 0;
    while(true) // FIXME: buffer bytes to an internal queue instead?
    {
        int ret = _writeBytes((const unsigned char*)str + written, len - written);
        if(ret > 0)
        {
            assert((unsigned)ret <= len);
            written += (unsigned)ret;
            if(written >= len)
                break;
        }
        else if(ret < 0)
        {
            int err = ret == -1 ? _GetError() : ret;
            traceprint("SendBytes: error %d: %s\n", err, _GetErrorStr(err).c_str());
            close();
            return false;
        }
        // and if ret == 0, keep trying.
    }

    assert(written == len);
    return true;
}